

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O0

int __thiscall
ncnn::Interp::eval_size_expr
          (Interp *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,int *outw,
          int *outh)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  const_reference pvVar5;
  int *in_RCX;
  value_type *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  int er;
  vector<int,_std::allocator<int>_> sizes;
  vector<int,_std::allocator<int>_> *in_stack_00000350;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_00000358;
  string *in_stack_00000360;
  uint in_stack_ffffffffffffffa0;
  vector<int,_std::allocator<int>_> local_40;
  int *local_28;
  value_type *local_20;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_18;
  int local_4;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x157d5a1);
  iVar2 = eval_list_expression(in_stack_00000360,in_stack_00000358,in_stack_00000350);
  if (iVar2 == 0) {
    bVar1 = std::vector<int,_std::allocator<int>_>::empty
                      ((vector<int,_std::allocator<int>_> *)(ulong)in_stack_ffffffffffffffa0);
    if (!bVar1) {
      sVar3 = std::vector<int,_std::allocator<int>_>::size(&local_40);
      if (sVar3 < 3) {
        sVar3 = std::vector<int,_std::allocator<int>_>::size(&local_40);
        if (sVar3 == 1) {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,0);
          *local_20 = *pvVar4;
          pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
          *local_28 = pvVar5->h;
        }
        else {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,0);
          *local_20 = *pvVar4;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,1);
          *local_28 = *pvVar4;
        }
        local_4 = 0;
        goto LAB_0157d6b6;
      }
    }
    local_4 = -1;
  }
  else {
    local_4 = -1;
  }
LAB_0157d6b6:
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar2,in_stack_ffffffffffffffa0));
  return local_4;
}

Assistant:

int Interp::eval_size_expr(const std::vector<Mat>& bottom_blobs, int& outw, int& outh) const
{
    // [size(@0,0),size(@0,1)]
    std::vector<int> sizes;
    int er = eval_list_expression(size_expr, bottom_blobs, sizes);
    if (er != 0)
        return -1;

    if (sizes.empty() || sizes.size() > 2)
        return -1;

    if (sizes.size() == 1)
    {
        outw = sizes[0];
        outh = bottom_blobs[0].h;
    }
    else
    {
        outw = sizes[0];
        outh = sizes[1];
    }

    return 0;
}